

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_us * stbi_load_16_from_memory
                    (stbi_uc *buffer,int len,int *x,int *y,int *channels_in_file,
                    int desired_channels)

{
  stbi__uint16 *psVar1;
  stbi__context s;
  stbi__context local_e0;
  
  local_e0.img_buffer_end = buffer + len;
  local_e0.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_e0.read_from_callbacks = 0;
  local_e0.callback_already_read = 0;
  local_e0.img_buffer = buffer;
  local_e0.img_buffer_original = buffer;
  local_e0.img_buffer_original_end = local_e0.img_buffer_end;
  psVar1 = stbi__load_and_postprocess_16bit(&local_e0,x,y,channels_in_file,desired_channels);
  return psVar1;
}

Assistant:

STBIDEF stbi_us *stbi_load_16_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *channels_in_file, int desired_channels)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_16bit(&s,x,y,channels_in_file,desired_channels);
}